

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * Catch::StringMaker<wchar_t_const*,void>::convert_abi_cxx11_(wchar_t *str)

{
  wchar_t *in_RSI;
  string *in_RDI;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_ffffffffffffff88;
  allocator local_45 [20];
  allocator local_31;
  wstring local_30 [48];
  
  if (in_RSI == (wchar_t *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"{null string}",local_45);
    std::allocator<char>::~allocator((allocator<char> *)local_45);
  }
  else {
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring(local_30,in_RSI,&local_31);
    Detail::stringify<std::__cxx11::wstring>(in_stack_ffffffffffffff88);
    std::__cxx11::wstring::~wstring(local_30);
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_31);
  }
  return in_RDI;
}

Assistant:

std::string StringMaker<wchar_t const*>::convert(wchar_t const * str) {
    if (str) {
        return ::Catch::Detail::stringify(std::wstring{ str });
    } else {
        return{ "{null string}" };
    }
}